

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O1

Action __thiscall
psy::C::TypeChecker::visitIdentifierName(TypeChecker *this,IdentifierNameSyntax *node)

{
  DeclarationCategory DVar1;
  int iVar2;
  Scope *this_00;
  Identifier *ident;
  DeclarationSymbol *this_01;
  MIXIN_TypeableDeclarationSymbol *pMVar3;
  undefined4 extraout_var;
  Compilation *this_02;
  Type *pTVar4;
  ostream *poVar5;
  
  this_00 = SemanticModel::scopeOf(this->semaModel_,node);
  if (this_00 == (Scope *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x263);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return Quit;
  }
  ident = identifierFrom(node);
  this_01 = Scope::searchForDeclaration(this_00,ident,OrdinaryIdentifiers);
  if (this_01 != (DeclarationSymbol *)0x0) {
    DVar1 = DeclarationSymbol::category(this_01);
    if (DVar1 < Type) {
      pMVar3 = MIXIN_TypeableDeclarationSymbol::from(this_01);
      if (pMVar3 != (MIXIN_TypeableDeclarationSymbol *)0x0) {
        iVar2 = (*pMVar3->_vptr_MIXIN_TypeableDeclarationSymbol[2])(pMVar3);
        this->ty_ = (Type *)CONCAT44(extraout_var,iVar2);
        return Skip;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                 ,0x5a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x26f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<empty message>",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      return Quit;
    }
    if (DVar1 != Type) {
      return Skip;
    }
  }
  this_02 = SemanticModel::compilation(this->semaModel_);
  pTVar4 = &Compilation::canonicalErrorType(this_02)->super_Type;
  this->ty_ = pTVar4;
  return Skip;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitIdentifierName(const IdentifierNameSyntax* node)
{
    auto scope = semaModel_->scopeOf(node);
    PSY_ASSERT_2(scope, return Action::Quit);
    auto decl = scope->searchForDeclaration(
                identifierFrom(node),
                NameSpace::OrdinaryIdentifiers);
    if (!decl)
        ty_ = semaModel_->compilation()->canonicalErrorType();
    else {
        switch (decl->category()) {
            case DeclarationCategory::Member:
            case DeclarationCategory::Function:
            case DeclarationCategory::Object: {
                auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
                PSY_ASSERT_2(typeableDecl, return Action::Quit);
                ty_ = typeableDecl->type();
                break;
            }
            case DeclarationCategory::Type:
                ty_ = semaModel_->compilation()->canonicalErrorType();
                break;
        }
    }

    return Action::Skip;
}